

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

ServiceOptions * __thiscall
google::protobuf::ServiceDescriptorProto::_internal_mutable_options(ServiceDescriptorProto *this)

{
  ServiceOptions *pSVar1;
  long in_RDI;
  ServiceOptions *p;
  ServiceDescriptorProto *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 2;
  if (*(long *)(in_RDI + 0x38) == 0) {
    GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    pSVar1 = MessageLite::CreateMaybeMessage<google::protobuf::ServiceOptions>((Arena *)0x4ebb61);
    *(ServiceOptions **)(in_RDI + 0x38) = pSVar1;
  }
  return *(ServiceOptions **)(in_RDI + 0x38);
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::ServiceOptions* ServiceDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::ServiceOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}